

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndPopup(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  uint uVar4;
  float fVar5;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if ((pIVar2->Flags & 0x4000000) == 0) {
    __assert_fail("g.CurrentWindow->Flags & ImGuiWindowFlags_Popup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0x13c8,"void ImGui::EndPopup()");
  }
  if (0 < (GImGui->CurrentPopupStack).Size) {
    if ((((GImGui->NavWindow == pIVar2) && (GImGui->NavMoveRequest == true)) &&
        ((GImGui->NavMoveResultLocal).ID == 0)) &&
       ((((GImGui->NavMoveResultOther).ID == 0 && ((GImGui->NavMoveDir & 0xfffffffeU) == 2)) &&
        ((GImGui->NavMoveRequestForward == ImGuiNavForward_None && (GImGui->NavLayer == 0)))))) {
      GImGui->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
      NavMoveRequestCancel();
      fVar5 = 0.0;
      if (pIVar3->NavMoveDir == 2) {
        fVar5 = (pIVar2->SizeFull).y;
        fVar1 = (pIVar2->SizeContents).y;
        uVar4 = -(uint)(fVar1 <= fVar5);
        fVar5 = (float)(~uVar4 & (uint)fVar1 | (uint)fVar5 & uVar4);
      }
      fVar5 = fVar5 - (pIVar2->Scroll).y;
      pIVar2 = pIVar3->NavWindow;
      pIVar2->NavRectRel[0].Max.y = fVar5;
      pIVar2->NavRectRel[0].Min.y = fVar5;
    }
    End();
    return;
  }
  __assert_fail("g.CurrentPopupStack.Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                ,0x13c9,"void ImGui::EndPopup()");
}

Assistant:

void ImGui::EndPopup()
{
    ImGuiContext& g = *GImGui; (void)g;
    IM_ASSERT(g.CurrentWindow->Flags & ImGuiWindowFlags_Popup);  // Mismatched BeginPopup()/EndPopup() calls
    IM_ASSERT(g.CurrentPopupStack.Size > 0);

    // Make all menus and popups wrap around for now, may need to expose that policy.
    NavProcessMoveRequestWrapAround(g.CurrentWindow);
    
    End();
}